

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

int asm_sunk_store(ASMState *as,IRIns *ira,IRIns *irs)

{
  IRIns *irk;
  IRIns *irs_local;
  IRIns *ira_local;
  ASMState *as_local;
  uint local_4;
  
  if ((irs->field_1).s == 0xff) {
    if (((((irs->field_1).o == 'G') || ((irs->field_1).o == 'H')) || ((irs->field_1).o == 'J')) ||
       ((irs->field_1).o == 'K')) {
      irk = as->ir + (irs->field_0).op1;
      if (((irk->field_1).o == '8') || ((irk->field_1).o == '9')) {
        irk = as->ir + (irk->field_0).op1;
      }
      local_4 = (uint)(as->ir + (irk->field_0).op1 == ira);
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = (uint)(ira + (int)(uint)(irs->field_1).s == irs);
  }
  return local_4;
}

Assistant:

static int asm_sunk_store(ASMState *as, IRIns *ira, IRIns *irs)
{
  if (irs->s == 255) {
    if (irs->o == IR_ASTORE || irs->o == IR_HSTORE ||
	irs->o == IR_FSTORE || irs->o == IR_XSTORE) {
      IRIns *irk = IR(irs->op1);
      if (irk->o == IR_AREF || irk->o == IR_HREFK)
	irk = IR(irk->op1);
      return (IR(irk->op1) == ira);
    }
    return 0;
  } else {
    return (ira + irs->s == irs);  /* Quick check. */
  }
}